

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

fnet_socket_t fnet_socket_connect(fnet_address_t *addr)

{
  int iVar1;
  sockaddr *in_RDI;
  int sock;
  fnet_socket_t local_4;
  
  if (in_RDI == (sockaddr *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = socket((uint)in_RDI->sa_family,0,0);
    if (local_4 == 0xffffffff) {
      local_4 = 0xffffffff;
    }
    else {
      iVar1 = connect(local_4,in_RDI,0x80);
      if (iVar1 == -1) {
        close(local_4);
        local_4 = 0xffffffff;
      }
    }
  }
  return local_4;
}

Assistant:

fnet_socket_t fnet_socket_connect(fnet_address_t const *addr)
{
    if (!addr)
    {
        FLOG_ERR("Invalid address");
        return FNET_INVALID_SOCKET;
    }

    int sock = socket(addr->ss_family, FNET_SOCK_STREAM, 0);
    if (sock == -1)
    {
        FLOG_ERR("Unable to create new socket");
        return FNET_INVALID_SOCKET;
    }

    if (connect(sock, (const struct sockaddr*)addr, sizeof *addr) == -1)
    {
        FLOG_ERR("Unable to establish new connection");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    return (fnet_socket_t)sock;
}